

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O0

void Interactive(HSQUIRRELVM v)

{
  undefined1 uVar1;
  int iVar2;
  SQChar *pSVar3;
  size_t sVar4;
  SQBool raiseerror;
  SQRESULT SVar5;
  HSQUIRRELVM in_RDI;
  SQInteger oldtop;
  int c;
  SQInteger i;
  SQInteger done;
  SQInteger retval;
  SQInteger string;
  SQInteger blocks;
  SQChar buffer [1024];
  SQInteger in_stack_fffffffffffffba8;
  HSQUIRRELVM in_stack_fffffffffffffbb0;
  HSQUIRRELVM in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  SQInteger in_stack_fffffffffffffbd0;
  long lVar6;
  HSQUIRRELVM v_00;
  HSQUIRRELVM v_01;
  SQFUNCTION func;
  HSQUIRRELVM v_02;
  char in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffbf9;
  SQWeakRef *in_stack_fffffffffffffc08;
  SQCollectable *in_stack_fffffffffffffc10;
  HSQUIRRELVM in_stack_fffffffffffffc18;
  
  v_02 = (HSQUIRRELVM)0x0;
  func = (SQFUNCTION)0x0;
  v_01 = (HSQUIRRELVM)0x0;
  v_00 = (HSQUIRRELVM)0x0;
  PrintVersionInfos();
  sq_pushroottable((HSQUIRRELVM)0x113ba5);
  sq_pushstring(v_01,(SQChar *)v_00,in_stack_fffffffffffffbd0);
  sq_pushuserpointer(v_01,v_00);
  sq_newclosure(v_02,func,(SQUnsignedInteger)v_01);
  sq_setparamscheck(in_stack_fffffffffffffc18,(SQInteger)in_stack_fffffffffffffc10,
                    (SQChar *)in_stack_fffffffffffffc08);
  sq_newslot(v_00,in_stack_fffffffffffffbd0,
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  sq_pop(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  do {
    if (v_00 != (HSQUIRRELVM)0x0) {
      return;
    }
    lVar6 = 0;
    printf("\nsq>");
LAB_00113c56:
    if (v_00 != (HSQUIRRELVM)0x0) {
      return;
    }
    iVar2 = getchar();
    if (iVar2 == 10) {
      if ((lVar6 < 1) || ((&stack0xfffffffffffffbf7)[lVar6] != '\\')) {
        if (v_02 == (HSQUIRRELVM)0x0) goto LAB_00113dc9;
      }
      else {
        (&stack0xfffffffffffffbf7)[lVar6] = 10;
      }
      (&stack0xfffffffffffffbf8)[lVar6] = 10;
LAB_00113dc4:
      lVar6 = lVar6 + 1;
      goto LAB_00113c56;
    }
    uVar1 = (undefined1)iVar2;
    if (iVar2 == 0x7d) {
      v_02 = (HSQUIRRELVM)((long)&v_02[-1]._suspended_traps + 7);
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_00113dc4;
    }
    if ((iVar2 == 0x7b) && (func == (SQFUNCTION)0x0)) {
      v_02 = (HSQUIRRELVM)
             ((long)&(v_02->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1);
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_00113dc4;
    }
    if ((iVar2 == 0x22) || (iVar2 == 0x27)) {
      func = (SQFUNCTION)(long)(int)(uint)((func != (SQFUNCTION)0x0 ^ 0xffU) & 1);
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_00113dc4;
    }
    if (lVar6 < 0x3ff) {
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_00113dc4;
    }
    fprintf(_stderr,"sq : input line too long\n");
LAB_00113dc9:
    (&stack0xfffffffffffffbf8)[lVar6] = 0;
    if (in_stack_fffffffffffffbf8 == '=') {
      pSVar3 = sq_getscratchpad(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      snprintf(pSVar3,0x400,"return (%s)",&stack0xfffffffffffffbf9);
      in_stack_fffffffffffffbb0 = (HSQUIRRELVM)&stack0xfffffffffffffbf8;
      in_stack_fffffffffffffbb8 =
           (HSQUIRRELVM)sq_getscratchpad(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      pSVar3 = sq_getscratchpad(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      sVar4 = strlen(pSVar3);
      memcpy(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,sVar4 + 1);
      v_01 = (HSQUIRRELVM)0x1;
    }
    sVar4 = strlen(&stack0xfffffffffffffbf8);
    if (0 < (long)sVar4) {
      raiseerror = sq_gettop(in_RDI);
      SVar5 = sq_compilebuffer(v_01,(SQChar *)v_00,sVar4,
                               (SQChar *)CONCAT44(iVar2,in_stack_fffffffffffffbc8),raiseerror);
      if (-1 < SVar5) {
        sq_pushroottable((HSQUIRRELVM)0x113edc);
        SVar5 = sq_call((HSQUIRRELVM)CONCAT71(in_stack_fffffffffffffbf9,in_stack_fffffffffffffbf8),
                        (SQInteger)v_02,(SQBool)func,(SQBool)v_01);
        if ((-1 < SVar5) && (v_01 != (HSQUIRRELVM)0x0)) {
          printf("\n");
          sq_pushroottable((HSQUIRRELVM)0x113f27);
          sq_pushstring(v_01,(SQChar *)v_00,sVar4);
          sq_get(in_stack_fffffffffffffbb8,(SQInteger)in_stack_fffffffffffffbb0);
          sq_pushroottable((HSQUIRRELVM)0x113f63);
          sq_push(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          sq_call((HSQUIRRELVM)CONCAT71(in_stack_fffffffffffffbf9,in_stack_fffffffffffffbf8),
                  (SQInteger)v_02,(SQBool)func,(SQBool)v_01);
          v_01 = (HSQUIRRELVM)0x0;
          printf("\n");
        }
      }
      sq_settop(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    }
  } while( true );
}

Assistant:

void Interactive(HSQUIRRELVM v)
{

#define MAXINPUT 1024
    SQChar buffer[MAXINPUT];
    SQInteger blocks =0;
    SQInteger string=0;
    SQInteger retval=0;
    SQInteger done=0;
    PrintVersionInfos();

    sq_pushroottable(v);
    sq_pushstring(v,_SC("quit"),-1);
    sq_pushuserpointer(v,&done);
    sq_newclosure(v,quit,1);
    sq_setparamscheck(v,1,NULL);
    sq_newslot(v,-3,SQFalse);
    sq_pop(v,1);

    while (!done)
    {
        SQInteger i = 0;
        scprintf(_SC("\nsq>"));
        for(;;) {
            int c;
            if(done)return;
            c = getchar();
            if (c == _SC('\n')) {
                if (i>0 && buffer[i-1] == _SC('\\'))
                {
                    buffer[i-1] = _SC('\n');
                }
                else if(blocks==0)break;
                buffer[i++] = _SC('\n');
            }
            else if (c==_SC('}')) {blocks--; buffer[i++] = (SQChar)c;}
            else if(c==_SC('{') && !string){
                    blocks++;
                    buffer[i++] = (SQChar)c;
            }
            else if(c==_SC('"') || c==_SC('\'')){
                    string=!string;
                    buffer[i++] = (SQChar)c;
            }
            else if (i >= MAXINPUT-1) {
                scfprintf(stderr, _SC("sq : input line too long\n"));
                break;
            }
            else{
                buffer[i++] = (SQChar)c;
            }
        }
        buffer[i] = _SC('\0');

        if(buffer[0]==_SC('=')){
            scsprintf(sq_getscratchpad(v,MAXINPUT),(size_t)MAXINPUT,_SC("return (%s)"),&buffer[1]);
            memcpy(buffer,sq_getscratchpad(v,-1),(scstrlen(sq_getscratchpad(v,-1))+1)*sizeof(SQChar));
            retval=1;
        }
        i=scstrlen(buffer);
        if(i>0){
            SQInteger oldtop=sq_gettop(v);
            if(SQ_SUCCEEDED(sq_compilebuffer(v,buffer,i,_SC("interactive console"),SQTrue))){
                sq_pushroottable(v);
                if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue)) &&  retval){
                    scprintf(_SC("\n"));
                    sq_pushroottable(v);
                    sq_pushstring(v,_SC("print"),-1);
                    sq_get(v,-2);
                    sq_pushroottable(v);
                    sq_push(v,-4);
                    sq_call(v,2,SQFalse,SQTrue);
                    retval=0;
                    scprintf(_SC("\n"));
                }
            }

            sq_settop(v,oldtop);
        }
    }
}